

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queueTest.cpp
# Opt level: O3

void relational_operator<std::queue<int,std::deque<int,std::allocator<int>>>>
               (queue<int,_std::deque<int,_std::allocator<int>_>_> *t1,char *s1,
               queue<int,_std::deque<int,_std::allocator<int>_>_> *t2,char *s2)

{
  _Elt_pointer piVar1;
  _Elt_pointer piVar2;
  _Elt_pointer piVar3;
  _Elt_pointer piVar4;
  _Map_pointer ppiVar5;
  _Map_pointer ppiVar6;
  _Elt_pointer piVar7;
  _Elt_pointer piVar8;
  char *pcVar9;
  queue<int,_std::deque<int,_std::allocator<int>_>_> *pqVar10;
  queue<int,_std::deque<int,_std::allocator<int>_>_> *pqVar11;
  bool bVar12;
  size_t sVar13;
  int *piVar14;
  int *piVar15;
  int *piVar16;
  long lVar17;
  int *piVar18;
  int *piVar19;
  int *piVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  int *piVar24;
  int *piVar25;
  _Map_pointer ppiVar26;
  _Map_pointer ppiVar27;
  _Deque_iterator<int,_const_int_&,_const_int_*> local_d8;
  _Deque_iterator<int,_const_int_&,_const_int_*> local_b8;
  _Deque_iterator<int,_const_int_&,_const_int_*> local_98;
  char *local_78;
  queue<int,_std::deque<int,_std::allocator<int>_>_> *local_70;
  _Map_pointer local_68;
  _Map_pointer local_60;
  int *local_58;
  int *local_50;
  queue<int,_std::deque<int,_std::allocator<int>_>_> *local_48;
  int *local_40;
  int *local_38;
  
  local_78 = s2;
  local_48 = t2;
  if (s1 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10c098);
  }
  else {
    sVar13 = strlen(s1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,s1,sVar13);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," is...",6);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  pqVar11 = local_48;
  ppiVar27 = (t1->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
             _M_finish._M_node;
  ppiVar26 = (t1->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
             _M_start._M_node;
  piVar1 = (t1->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
           _M_finish._M_cur;
  piVar2 = (t1->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
           _M_finish._M_first;
  piVar3 = (t1->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
           _M_start._M_cur;
  piVar4 = (t1->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
           _M_start._M_last;
  ppiVar5 = (local_48->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  ppiVar6 = (local_48->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
            super__Deque_impl_data._M_start._M_node;
  piVar7 = (local_48->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data
           ._M_start._M_cur;
  piVar8 = (local_48->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data
           ._M_start._M_last;
  local_70 = t1;
  if (((long)piVar4 - (long)piVar3 >> 2) + ((long)piVar1 - (long)piVar2 >> 2) +
      ((((ulong)((long)ppiVar27 - (long)ppiVar26) >> 3) - 1) +
      (ulong)(ppiVar27 == (_Map_pointer)0x0)) * 0x80 ==
      ((long)piVar8 - (long)piVar7 >> 2) +
      ((long)(local_48->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur -
       (long)(local_48->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_first >> 2) +
      ((((ulong)((long)ppiVar5 - (long)ppiVar6) >> 3) - 1) + (ulong)(ppiVar5 == (_Map_pointer)0x0))
      * 0x80) {
    local_b8._M_first =
         (t1->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
         _M_start._M_first;
    local_98._M_last =
         (t1->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
         _M_finish._M_last;
    local_d8._M_first =
         (local_48->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
         _M_start._M_first;
    local_d8._M_cur = piVar7;
    local_d8._M_last = piVar8;
    local_d8._M_node = ppiVar6;
    local_b8._M_cur = piVar3;
    local_b8._M_last = piVar4;
    local_b8._M_node = ppiVar26;
    local_98._M_cur = piVar1;
    local_98._M_first = piVar2;
    local_98._M_node = ppiVar27;
    bVar12 = std::
             __equal_dit<int,int_const&,int_const*,std::_Deque_iterator<int,int_const&,int_const*>>
                       (&local_b8,&local_98,&local_d8);
    if (bVar12) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"equal to",8);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
      std::ostream::put(-0x68);
      std::ostream::flush();
    }
  }
  pqVar10 = local_70;
  ppiVar27 = (local_70->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node;
  ppiVar26 = (local_70->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_start._M_node;
  piVar1 = (local_70->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data
           ._M_finish._M_cur;
  piVar2 = (local_70->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data
           ._M_finish._M_first;
  piVar3 = (local_70->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data
           ._M_start._M_cur;
  piVar4 = (local_70->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data
           ._M_start._M_last;
  ppiVar5 = (pqVar11->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data
            ._M_finish._M_node;
  ppiVar6 = (pqVar11->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data
            ._M_start._M_node;
  piVar7 = (pqVar11->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
           _M_start._M_cur;
  piVar8 = (pqVar11->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
           _M_start._M_last;
  if (((long)piVar4 - (long)piVar3 >> 2) + ((long)piVar1 - (long)piVar2 >> 2) +
      ((((ulong)((long)ppiVar27 - (long)ppiVar26) >> 3) - 1) +
      (ulong)(ppiVar27 == (_Map_pointer)0x0)) * 0x80 ==
      ((long)piVar8 - (long)piVar7 >> 2) +
      ((long)(pqVar11->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur -
       (long)(pqVar11->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_first >> 2) +
      ((((ulong)((long)ppiVar5 - (long)ppiVar6) >> 3) - 1) + (ulong)(ppiVar5 == (_Map_pointer)0x0))
      * 0x80) {
    local_b8._M_first =
         (local_70->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
         _M_start._M_first;
    local_98._M_last =
         (local_70->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
         _M_finish._M_last;
    local_d8._M_first =
         (local_48->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
         _M_start._M_first;
    local_d8._M_cur = piVar7;
    local_d8._M_last = piVar8;
    local_d8._M_node = ppiVar6;
    local_b8._M_cur = piVar3;
    local_b8._M_last = piVar4;
    local_b8._M_node = ppiVar26;
    local_98._M_cur = piVar1;
    local_98._M_first = piVar2;
    local_98._M_node = ppiVar27;
    bVar12 = std::
             __equal_dit<int,int_const&,int_const*,std::_Deque_iterator<int,int_const&,int_const*>>
                       (&local_b8,&local_98,&local_d8);
    if (bVar12) goto LAB_00103e3b;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"not equal to",0xc);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
LAB_00103e3b:
  piVar15 = (pqVar10->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data
            ._M_start._M_cur;
  local_40 = (pqVar10->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
  local_68 = (pqVar10->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node;
  piVar14 = (local_48->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  local_38 = (local_48->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
  local_60 = (local_48->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node;
  piVar19 = piVar14;
  if (piVar15 != local_40) {
    ppiVar26 = (local_48->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_start._M_node;
    local_58 = (local_48->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_start._M_first;
    piVar18 = (local_48->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
              super__Deque_impl_data._M_start._M_last;
    ppiVar27 = (pqVar10->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_start._M_node;
    local_50 = (pqVar10->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_start._M_first;
    piVar16 = (pqVar10->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
              super__Deque_impl_data._M_start._M_last;
    piVar24 = piVar14;
    piVar25 = piVar15;
    do {
      piVar19 = piVar18;
      if (ppiVar26 == local_60) {
        piVar19 = local_38;
      }
      if ((long)piVar19 - (long)piVar24 == 0) goto LAB_0010402b;
      lVar22 = (long)piVar19 - (long)piVar24 >> 2;
      piVar19 = piVar16;
      if (ppiVar27 == local_68) {
        piVar19 = local_40;
      }
      lVar17 = (long)piVar19 - (long)piVar25 >> 2;
      if (lVar22 < lVar17) {
        lVar17 = lVar22;
      }
      piVar20 = piVar24;
      if (lVar17 != 0) {
        lVar22 = 0;
        do {
          if (lVar17 * 4 - lVar22 == 0) goto LAB_0010402b;
          if (*(int *)((long)piVar25 + lVar22) < *(int *)((long)piVar24 + lVar22))
          goto LAB_00103fbd;
          if (*(int *)((long)piVar24 + lVar22) < *(int *)((long)piVar25 + lVar22))
          goto LAB_0010402b;
          lVar22 = lVar22 + 4;
        } while (lVar17 * 4 - lVar22 != 0);
        piVar20 = (int *)(lVar22 + (long)piVar24);
      }
      piVar19 = piVar24 + lVar17;
      if (piVar20 != piVar19) goto LAB_00103fbd;
      uVar21 = ((long)piVar25 - (long)local_50 >> 2) + lVar17;
      if ((long)uVar21 < 0) {
        uVar23 = (long)uVar21 >> 7;
LAB_00103f46:
        ppiVar27 = ppiVar27 + uVar23;
        local_50 = *ppiVar27;
        piVar16 = local_50 + 0x80;
        piVar25 = local_50 + uVar21 + uVar23 * -0x80;
      }
      else {
        if (0x7f < uVar21) {
          uVar23 = uVar21 >> 7;
          goto LAB_00103f46;
        }
        piVar25 = piVar25 + lVar17;
      }
      uVar21 = lVar17 + ((long)piVar24 - (long)local_58 >> 2);
      if ((long)uVar21 < 0) {
        uVar23 = (long)uVar21 >> 7;
LAB_00103f8a:
        ppiVar26 = ppiVar26 + uVar23;
        local_58 = *ppiVar26;
        piVar18 = local_58 + 0x80;
        piVar19 = local_58 + uVar21 + uVar23 * -0x80;
      }
      else if (0x7f < uVar21) {
        uVar23 = uVar21 >> 7;
        goto LAB_00103f8a;
      }
      piVar24 = piVar19;
    } while (piVar25 != local_40);
  }
  if (local_38 != piVar19) {
LAB_00103fbd:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"smaller than",0xc);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    piVar14 = (local_48->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur;
    local_38 = (local_48->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
    local_60 = (local_48->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node;
    piVar15 = (pqVar10->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur;
    local_40 = (pqVar10->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
    local_68 = (pqVar10->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node;
  }
LAB_0010402b:
  piVar19 = piVar15;
  if (piVar14 != local_38) {
    ppiVar26 = (pqVar10->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_start._M_node;
    local_50 = (pqVar10->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_start._M_first;
    piVar18 = (pqVar10->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
              super__Deque_impl_data._M_start._M_last;
    ppiVar27 = (local_48->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_start._M_node;
    piVar16 = (local_48->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
              super__Deque_impl_data._M_start._M_first;
    local_58 = (local_48->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_start._M_last;
    piVar24 = piVar15;
    piVar25 = piVar14;
    do {
      piVar19 = piVar18;
      if (ppiVar26 == local_68) {
        piVar19 = local_40;
      }
      if ((long)piVar19 - (long)piVar24 == 0) goto LAB_00104187;
      lVar22 = (long)piVar19 - (long)piVar24 >> 2;
      piVar19 = local_58;
      if (ppiVar27 == local_60) {
        piVar19 = local_38;
      }
      lVar17 = (long)piVar19 - (long)piVar25 >> 2;
      if (lVar22 < lVar17) {
        lVar17 = lVar22;
      }
      piVar20 = piVar24;
      if (lVar17 != 0) {
        lVar22 = 0;
        do {
          if (lVar17 * 4 - lVar22 == 0) goto LAB_00104187;
          if (*(int *)((long)piVar25 + lVar22) < *(int *)((long)piVar24 + lVar22))
          goto LAB_001041f5;
          if (*(int *)((long)piVar24 + lVar22) < *(int *)((long)piVar25 + lVar22))
          goto LAB_00104187;
          lVar22 = lVar22 + 4;
        } while (lVar17 * 4 - lVar22 != 0);
        piVar20 = (int *)(lVar22 + (long)piVar24);
      }
      piVar19 = piVar24 + lVar17;
      if (piVar20 != piVar19) goto LAB_001041f5;
      uVar21 = ((long)piVar25 - (long)piVar16 >> 2) + lVar17;
      if ((long)uVar21 < 0) {
        uVar23 = (long)uVar21 >> 7;
LAB_0010410f:
        ppiVar27 = ppiVar27 + uVar23;
        piVar16 = *ppiVar27;
        local_58 = piVar16 + 0x80;
        piVar25 = piVar16 + uVar21 + uVar23 * -0x80;
      }
      else {
        if (0x7f < uVar21) {
          uVar23 = uVar21 >> 7;
          goto LAB_0010410f;
        }
        piVar25 = piVar25 + lVar17;
      }
      uVar21 = lVar17 + ((long)piVar24 - (long)local_50 >> 2);
      if ((long)uVar21 < 0) {
        uVar23 = (long)uVar21 >> 7;
LAB_00104157:
        ppiVar26 = ppiVar26 + uVar23;
        local_50 = *ppiVar26;
        piVar18 = local_50 + 0x80;
        piVar19 = local_50 + uVar21 + uVar23 * -0x80;
      }
      else if (0x7f < uVar21) {
        uVar23 = uVar21 >> 7;
        goto LAB_00104157;
      }
      piVar24 = piVar19;
    } while (piVar25 != local_38);
  }
  if (local_40 == piVar19) {
LAB_00104187:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"smaller than or equal to",0x18);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    piVar14 = (local_48->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur;
    local_38 = (local_48->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
    local_60 = (local_48->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node;
    piVar15 = (pqVar10->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur;
    local_40 = (pqVar10->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
    local_68 = (pqVar10->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node;
  }
LAB_001041f5:
  piVar19 = piVar15;
  if (piVar14 != local_38) {
    ppiVar26 = (pqVar10->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_start._M_node;
    local_58 = (pqVar10->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_start._M_first;
    piVar25 = (pqVar10->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
              super__Deque_impl_data._M_start._M_last;
    ppiVar27 = (local_48->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_start._M_node;
    local_50 = (local_48->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_start._M_first;
    piVar18 = (local_48->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
              super__Deque_impl_data._M_start._M_last;
    piVar24 = piVar15;
    piVar16 = piVar14;
    do {
      piVar19 = piVar25;
      if (ppiVar26 == local_68) {
        piVar19 = local_40;
      }
      if ((long)piVar19 - (long)piVar24 == 0) goto LAB_001043bd;
      lVar22 = (long)piVar19 - (long)piVar24 >> 2;
      piVar19 = piVar18;
      if (ppiVar27 == local_60) {
        piVar19 = local_38;
      }
      lVar17 = (long)piVar19 - (long)piVar16 >> 2;
      if (lVar22 < lVar17) {
        lVar17 = lVar22;
      }
      piVar20 = piVar24;
      if (lVar17 != 0) {
        lVar22 = 0;
        do {
          if (lVar17 * 4 - lVar22 == 0) goto LAB_001043bd;
          if (*(int *)((long)piVar16 + lVar22) < *(int *)((long)piVar24 + lVar22))
          goto LAB_0010434f;
          if (*(int *)((long)piVar24 + lVar22) < *(int *)((long)piVar16 + lVar22))
          goto LAB_001043bd;
          lVar22 = lVar22 + 4;
        } while (lVar17 * 4 - lVar22 != 0);
        piVar20 = (int *)(lVar22 + (long)piVar24);
      }
      piVar19 = piVar24 + lVar17;
      if (piVar20 != piVar19) goto LAB_0010434f;
      uVar21 = ((long)piVar16 - (long)local_50 >> 2) + lVar17;
      if ((long)uVar21 < 0) {
        uVar23 = (long)uVar21 >> 7;
LAB_001042d9:
        ppiVar27 = ppiVar27 + uVar23;
        local_50 = *ppiVar27;
        piVar18 = local_50 + 0x80;
        piVar16 = local_50 + uVar21 + uVar23 * -0x80;
      }
      else {
        if (0x7f < uVar21) {
          uVar23 = uVar21 >> 7;
          goto LAB_001042d9;
        }
        piVar16 = piVar16 + lVar17;
      }
      uVar21 = lVar17 + ((long)piVar24 - (long)local_58 >> 2);
      if ((long)uVar21 < 0) {
        uVar23 = (long)uVar21 >> 7;
LAB_0010431c:
        ppiVar26 = ppiVar26 + uVar23;
        local_58 = *ppiVar26;
        piVar25 = local_58 + 0x80;
        piVar19 = local_58 + uVar21 + uVar23 * -0x80;
      }
      else if (0x7f < uVar21) {
        uVar23 = uVar21 >> 7;
        goto LAB_0010431c;
      }
      piVar24 = piVar19;
    } while (piVar16 != local_38);
  }
  if (local_40 != piVar19) {
LAB_0010434f:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"greater than",0xc);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    piVar15 = (pqVar10->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur;
    local_40 = (pqVar10->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
    local_68 = (pqVar10->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node;
    piVar14 = (local_48->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur;
    local_38 = (local_48->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
    local_60 = (local_48->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node;
  }
LAB_001043bd:
  if (piVar15 != local_40) {
    ppiVar26 = (local_48->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_start._M_node;
    piVar16 = (local_48->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
              super__Deque_impl_data._M_start._M_first;
    piVar18 = (local_48->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
              super__Deque_impl_data._M_start._M_last;
    ppiVar27 = (pqVar10->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_start._M_node;
    piVar25 = (pqVar10->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
              super__Deque_impl_data._M_start._M_first;
    piVar19 = (pqVar10->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
              super__Deque_impl_data._M_start._M_last;
    do {
      piVar24 = piVar18;
      if (ppiVar26 == local_60) {
        piVar24 = local_38;
      }
      if ((long)piVar24 - (long)piVar14 == 0) goto LAB_00104512;
      lVar22 = (long)piVar24 - (long)piVar14 >> 2;
      piVar24 = piVar19;
      if (ppiVar27 == local_68) {
        piVar24 = local_40;
      }
      lVar17 = (long)piVar24 - (long)piVar15 >> 2;
      if (lVar22 < lVar17) {
        lVar17 = lVar22;
      }
      piVar24 = piVar14;
      if (lVar17 != 0) {
        lVar22 = 0;
        do {
          if (lVar17 * 4 - lVar22 == 0) goto LAB_00104512;
          if (*(int *)((long)piVar15 + lVar22) < *(int *)((long)piVar14 + lVar22))
          goto LAB_0010454d;
          if (*(int *)((long)piVar14 + lVar22) < *(int *)((long)piVar15 + lVar22))
          goto LAB_00104512;
          lVar22 = lVar22 + 4;
        } while (lVar17 * 4 - lVar22 != 0);
        piVar24 = (int *)(lVar22 + (long)piVar14);
      }
      if (piVar24 != piVar14 + lVar17) goto LAB_0010454d;
      uVar21 = ((long)piVar15 - (long)piVar25 >> 2) + lVar17;
      if ((long)uVar21 < 0) {
        uVar23 = (long)uVar21 >> 7;
LAB_00104495:
        ppiVar27 = ppiVar27 + uVar23;
        piVar25 = *ppiVar27;
        piVar19 = piVar25 + 0x80;
        piVar15 = piVar25 + uVar21 + uVar23 * -0x80;
      }
      else {
        if (0x7f < uVar21) {
          uVar23 = uVar21 >> 7;
          goto LAB_00104495;
        }
        piVar15 = piVar15 + lVar17;
      }
      uVar21 = lVar17 + ((long)piVar14 - (long)piVar16 >> 2);
      if ((long)uVar21 < 0) {
        uVar23 = (long)uVar21 >> 7;
LAB_001044da:
        ppiVar26 = ppiVar26 + uVar23;
        piVar16 = *ppiVar26;
        piVar18 = piVar16 + 0x80;
        piVar14 = piVar16 + uVar21 + uVar23 * -0x80;
      }
      else {
        piVar14 = piVar14 + lVar17;
        if (0x7f < uVar21) {
          uVar23 = uVar21 >> 7;
          goto LAB_001044da;
        }
      }
    } while (piVar15 != local_40);
  }
  if (local_38 == piVar14) {
LAB_00104512:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"greater than or equal to",0x18);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
  }
LAB_0010454d:
  pcVar9 = local_78;
  if (local_78 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10c098);
  }
  else {
    sVar13 = strlen(local_78);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar9,sVar13);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"!\n",2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  return;
}

Assistant:

void 	relational_operator(T const & t1, char const * s1, T const & t2, char const * s2) {
	std::cout << s1 << " is..." << std::endl;

	if (t1 == t2) std::cout << "equal to" << std::endl;
	if (t1 != t2) std::cout << "not equal to" << std::endl;
	if (t1 < t2) std::cout << "smaller than" << std::endl;
	if (t1 <= t2) std::cout << "smaller than or equal to" << std::endl;
	if (t1 > t2) std::cout << "greater than" << std::endl;
	if (t1 >= t2) std::cout << "greater than or equal to" << std::endl;

	std::cout << s2 << "!\n" << std::endl;
}